

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O2

long gimage::cmp<float>(Image<float,_gimage::PixelTraits<float>_> *diff,
                       Image<float,_gimage::PixelTraits<float>_> *im1,
                       Image<float,_gimage::PixelTraits<float>_> *im2,
                       vector<float,_std::allocator<float>_> *tol)

{
  pointer pfVar1;
  pointer pfVar2;
  float ***pppfVar3;
  float ***pppfVar4;
  float ***pppfVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  
  lVar6 = -1;
  if (((im1->width == im2->width) && (im1->height == im2->height)) && (im1->depth == im2->depth)) {
    Image<float,_gimage::PixelTraits<float>_>::setSize(diff,im1->width,im1->height,(long)im1->depth)
    ;
    pfVar1 = (tol->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = (tol->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar9 = im1->height;
    if (im1->height < 1) {
      uVar9 = 0;
    }
    uVar7 = (ulong)(uint)im1->depth;
    if (im1->depth < 1) {
      uVar7 = 0;
    }
    fVar14 = 0.0;
    lVar6 = 0;
    for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      if ((long)uVar11 < (long)(int)((ulong)((long)pfVar2 - (long)pfVar1) >> 2)) {
        fVar14 = pfVar1[uVar11];
      }
      lVar12 = im1->width;
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      for (uVar13 = 0; uVar13 != uVar9; uVar13 = uVar13 + 1) {
        pppfVar3 = im1->img;
        pppfVar4 = im2->img;
        pppfVar5 = diff->img;
        for (lVar8 = 0; lVar12 != lVar8; lVar8 = lVar8 + 1) {
          fVar10 = ABS(pppfVar4[uVar11][uVar13][lVar8]);
          if ((uint)ABS(pppfVar3[uVar11][uVar13][lVar8]) < 0x7f800000) {
            if (0x7f7fffff < (uint)fVar10) goto LAB_0012e979;
            fVar15 = pppfVar3[uVar11][uVar13][lVar8] - pppfVar4[uVar11][uVar13][lVar8];
          }
          else {
            fVar15 = 0.0;
            if ((uint)fVar10 < 0x7f800000) {
LAB_0012e979:
              fVar15 = INFINITY;
            }
          }
          lVar6 = lVar6 + (ulong)(fVar14 < fVar15);
          pppfVar5[uVar11][uVar13][lVar8] = fVar15;
        }
      }
    }
  }
  return lVar6;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}